

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O2

double __thiscall
iDynTree::InverseKinematics::getCenterOfMassProjectionMargin(InverseKinematics *this)

{
  missingIpoptErrorReport();
  return 0.0;
}

Assistant:

double InverseKinematics::getCenterOfMassProjectionMargin()
    {
#ifdef IDYNTREE_USES_IPOPT
        if (!IK_PIMPL(m_pimpl)->m_problemInitialized) {
            IK_PIMPL(m_pimpl)->computeProblemSizeAndResizeBuffers();
        }

        // Compute center of mass in the first constraint frame
        iDynTree::KinDynComputations & kinDyn = IK_PIMPL(m_pimpl)->m_dynamics;
        assert(IK_PIMPL(m_pimpl)->m_comHullConstraint.supportFrameIndices.size() > 0);
        iDynTree::Position comInAbsoluteConstraintFrame =
            IK_PIMPL(m_pimpl)->m_comHullConstraint.absoluteFrame_X_supportFrame[0]*(kinDyn.getWorldTransform(IK_PIMPL(m_pimpl)->m_comHullConstraint.supportFrameIndices[0]).inverse()*kinDyn.getCenterOfMassPosition());

        iDynTree::Vector2 comProjection = IK_PIMPL(m_pimpl)->m_comHullConstraint.projectAlongDirection(comInAbsoluteConstraintFrame);
        return IK_PIMPL(m_pimpl)->m_comHullConstraint.computeMargin(comProjection);
#else
        return missingIpoptErrorReport();
#endif
    }